

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::expand(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar2;
  char cVar3;
  bool bVar4;
  int item;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar5;
  long in_FS_OFFSET;
  Bucket BVar6;
  QHashDummyValue local_59;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index->r < 0) || (index->c < 0)) goto LAB_0059d698;
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (index->m).ptr;
  if (pQVar1 != (this_00->super_QAbstractItemViewPrivate).model) goto LAB_0059d698;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
LAB_0059d6ed:
    local_58.m.ptr = (index->m).ptr;
    local_58.r = index->r;
    local_58.c = index->c;
    local_58.i = index->i;
    this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90);
    if (this_01 !=
        (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
         *)0x0) {
      BVar6 = QHashPrivate::
              Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              ::findBucket<QtPrivate::QModelIndexWrapper>(this_01,(QModelIndexWrapper *)&local_58);
      if ((BVar6.span[BVar6.index] != (Span)0xff) && (*(long *)(BVar6.span + 0x80) != 0)) {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,index);
        pDVar2 = (this_00->expandedIndexes).q_hash.d;
        if (pDVar2 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
        }
        else {
          pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                   findNode<QPersistentModelIndex>(pDVar2,(QPersistentModelIndex *)&local_58);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
          if (pNVar5 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_0059d698;
        }
      }
    }
  }
  else {
    cVar3 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index);
    if (cVar3 < '\0') goto LAB_0059d698;
    pQVar1 = (index->m).ptr;
    if ((pQVar1 == (QAbstractItemModel *)0x0) ||
       (cVar3 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index), -1 < cVar3))
    goto LAB_0059d6ed;
  }
  if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) {
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,index);
    pDVar2 = (this_00->expandedIndexes).q_hash.d;
    if ((pDVar2 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) &&
       (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>(pDVar2,(QPersistentModelIndex *)&local_58),
       pNVar5 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0)) {
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
      goto LAB_0059d698;
    }
    QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QPersistentModelIndex,QHashDummyValue> *)&this_00->expandedIndexes,
               (QPersistentModelIndex *)&local_58,&local_59);
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
  }
  else {
    item = QTreeViewPrivate::viewIndex(this_00,index);
    if (item != -1) {
      QTreeViewPrivate::expand(this_00,item,true);
      if ((this_00->super_QAbstractItemViewPrivate).state != AnimatingState) {
        (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x268))(this);
        QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        viewport);
      }
      goto LAB_0059d698;
    }
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,index);
    bVar4 = QTreeViewPrivate::storeExpanded(this_00,(QPersistentModelIndex *)&local_58);
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
    if (!bVar4) goto LAB_0059d698;
  }
  local_58.r = 0;
  local_58.c = 0;
  local_58.i = (quintptr)index;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
LAB_0059d698:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expand(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;
    if (d->isIndexExpanded(index))
        return;
    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just store the expanded index, no need to layout.
        if (d->storeExpanded(index))
            emit expanded(index);
        return;
    }

    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->expand(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            d->viewport->update();
        }
    } else if (d->storeExpanded(index)) {
        emit expanded(index);
    }
}